

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapi_curl.c
# Opt level: O1

HTTPAPI_RESULT HTTPAPI_CloneOption(char *optionName,void *value,void **savedValue)

{
  uint uVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  uint *puVar4;
  HTTPAPI_RESULT HVar5;
  char *pcVar6;
  
  if ((value == (void *)0x0 || optionName == (char *)0x0) || savedValue == (void **)0x0) {
    p_Var3 = xlogging_get_log_function();
    HVar5 = HTTPAPI_INVALID_ARG;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return HTTPAPI_INVALID_ARG;
    }
    pcVar6 = "invalid argument(NULL) passed to HTTPAPI_CloneOption";
    iVar2 = 0x487;
  }
  else {
    iVar2 = strcmp("timeout",optionName);
    if (iVar2 == 0) {
      puVar4 = (uint *)malloc(4);
      if (puVar4 != (uint *)0x0) {
        *puVar4 = *value;
        goto LAB_0010a5fe;
      }
      p_Var3 = xlogging_get_log_function();
      HVar5 = HTTPAPI_ERROR;
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return HTTPAPI_ERROR;
      }
      pcVar6 = "malloc failed (result = %s%s (%d))";
      iVar2 = 0x492;
    }
    else {
      iVar2 = strcmp("x509certificate",optionName);
      if ((iVar2 == 0) || (iVar2 = strcmp("x509EccCertificate",optionName), iVar2 == 0)) {
        iVar2 = mallocAndStrcpy_s((char **)savedValue,(char *)value);
        if (iVar2 == 0) {
          return HTTPAPI_OK;
        }
        p_Var3 = xlogging_get_log_function();
        HVar5 = HTTPAPI_ERROR;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return HTTPAPI_ERROR;
        }
        pcVar6 = "unable to clone the x509 certificate content";
        iVar2 = 0x4a0;
      }
      else {
        iVar2 = strcmp("x509PrivatekeyType",optionName);
        if (iVar2 == 0) {
          uVar1 = *value;
          if (uVar1 < 2) {
            puVar4 = (uint *)malloc(4);
            if (puVar4 != (uint *)0x0) {
              *puVar4 = uVar1;
              goto LAB_0010a5fe;
            }
            p_Var3 = xlogging_get_log_function();
            HVar5 = HTTPAPI_ERROR;
            if (p_Var3 == (LOGGER_LOG)0x0) {
              return HTTPAPI_ERROR;
            }
            pcVar6 = "unable to clone x509PrivatekeyType";
            iVar2 = 0x4b2;
          }
          else {
            p_Var3 = xlogging_get_log_function();
            HVar5 = HTTPAPI_ERROR;
            if (p_Var3 == (LOGGER_LOG)0x0) {
              return HTTPAPI_ERROR;
            }
            pcVar6 = "Unknown x509PrivatekeyType: %i";
            iVar2 = 0x4be;
          }
        }
        else {
          iVar2 = strcmp("Engine",optionName);
          if (iVar2 == 0) {
            iVar2 = mallocAndStrcpy_s((char **)savedValue,(char *)value);
            if (iVar2 == 0) {
              return HTTPAPI_OK;
            }
            p_Var3 = xlogging_get_log_function();
            HVar5 = HTTPAPI_ERROR;
            if (p_Var3 == (LOGGER_LOG)0x0) {
              return HTTPAPI_ERROR;
            }
            pcVar6 = "unable to clone %s";
            iVar2 = 0x4c7;
          }
          else {
            iVar2 = strcmp("x509privatekey",optionName);
            if ((iVar2 == 0) || (iVar2 = strcmp("x509EccAliasKey",optionName), iVar2 == 0)) {
              iVar2 = mallocAndStrcpy_s((char **)savedValue,(char *)value);
              if (iVar2 == 0) {
                return HTTPAPI_OK;
              }
              p_Var3 = xlogging_get_log_function();
              HVar5 = HTTPAPI_ERROR;
              if (p_Var3 == (LOGGER_LOG)0x0) {
                return HTTPAPI_ERROR;
              }
              pcVar6 = "unable to clone the x509 private key content";
              iVar2 = 0x4d6;
            }
            else {
              iVar2 = strcmp("TrustedCerts",optionName);
              if (iVar2 == 0) {
                iVar2 = mallocAndStrcpy_s((char **)savedValue,(char *)value);
                if (iVar2 == 0) {
                  return HTTPAPI_OK;
                }
                p_Var3 = xlogging_get_log_function();
                HVar5 = HTTPAPI_ERROR;
                if (p_Var3 == (LOGGER_LOG)0x0) {
                  return HTTPAPI_ERROR;
                }
                pcVar6 = "unable to clone TrustedCerts";
                iVar2 = 0x4e3;
              }
              else {
                iVar2 = strcmp("proxy_data",optionName);
                if (iVar2 == 0) {
                  puVar4 = (uint *)malloc(0x20);
                  if (puVar4 != (uint *)0x0) {
                    *(undefined8 *)puVar4 = *value;
                    puVar4[2] = *(uint *)((long)value + 8);
                    *(undefined8 *)(puVar4 + 6) = *(undefined8 *)((long)value + 0x18);
                    *(undefined8 *)(puVar4 + 4) = *(undefined8 *)((long)value + 0x10);
LAB_0010a5fe:
                    *savedValue = puVar4;
                    return HTTPAPI_OK;
                  }
                  p_Var3 = xlogging_get_log_function();
                  HVar5 = HTTPAPI_ERROR;
                  if (p_Var3 == (LOGGER_LOG)0x0) {
                    return HTTPAPI_ERROR;
                  }
                  pcVar6 = "unable to allocate proxy option information";
                  iVar2 = 0x4f3;
                }
                else {
                  iVar2 = strcmp("CURLOPT_LOW_SPEED_LIMIT",optionName);
                  if ((((iVar2 == 0) ||
                       (iVar2 = strcmp("CURLOPT_LOW_SPEED_TIME",optionName), iVar2 == 0)) ||
                      (iVar2 = strcmp("CURLOPT_FRESH_CONNECT",optionName), iVar2 == 0)) ||
                     ((iVar2 = strcmp("CURLOPT_FORBID_REUSE",optionName), iVar2 == 0 ||
                      (iVar2 = strcmp("CURLOPT_VERBOSE",optionName), iVar2 == 0)))) {
                    puVar4 = (uint *)malloc(8);
                    if (puVar4 != (uint *)0x0) {
                      *(undefined8 *)puVar4 = *value;
                      goto LAB_0010a5fe;
                    }
                    p_Var3 = xlogging_get_log_function();
                    HVar5 = HTTPAPI_ERROR;
                    if (p_Var3 == (LOGGER_LOG)0x0) {
                      return HTTPAPI_ERROR;
                    }
                    pcVar6 = "malloc failed (result = %s%s (%d))";
                    iVar2 = 0x50e;
                  }
                  else {
                    iVar2 = strcmp("CURLOPT_INTERFACE",optionName);
                    if (iVar2 == 0) {
                      iVar2 = mallocAndStrcpy_s((char **)savedValue,(char *)value);
                      if (iVar2 == 0) {
                        return HTTPAPI_OK;
                      }
                      p_Var3 = xlogging_get_log_function();
                      HVar5 = HTTPAPI_ERROR;
                      if (p_Var3 == (LOGGER_LOG)0x0) {
                        return HTTPAPI_ERROR;
                      }
                      pcVar6 = "unable to clone the interface name";
                      iVar2 = 0x51b;
                    }
                    else {
                      p_Var3 = xlogging_get_log_function();
                      HVar5 = HTTPAPI_INVALID_ARG;
                      if (p_Var3 == (LOGGER_LOG)0x0) {
                        return HTTPAPI_INVALID_ARG;
                      }
                      pcVar6 = "unknown option %s";
                      iVar2 = 0x527;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/httpapi_curl.c"
            ,"HTTPAPI_CloneOption",iVar2,1,pcVar6);
  return HVar5;
}

Assistant:

HTTPAPI_RESULT HTTPAPI_CloneOption(const char* optionName, const void* value, const void** savedValue)
{
    HTTPAPI_RESULT result;
    if (
        (optionName == NULL) ||
        (value == NULL) ||
        (savedValue == NULL)
        )
    {
        result = HTTPAPI_INVALID_ARG;
        LogError("invalid argument(NULL) passed to HTTPAPI_CloneOption");
    }
    else
    {
        if (strcmp(OPTION_HTTP_TIMEOUT, optionName) == 0)
        {
            /*by convention value is pointing to an unsigned int */
            unsigned int* temp = malloc(sizeof(unsigned int)); /*shall be freed by HTTPAPIEX*/
            if (temp == NULL)
            {
                result = HTTPAPI_ERROR;
                LogError("malloc failed (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else
            {
                *temp = *(const unsigned int*)value;
                *savedValue = temp;
                result = HTTPAPI_OK;
            }
        }
        else if (strcmp(SU_OPTION_X509_CERT, optionName) == 0 || strcmp(OPTION_X509_ECC_CERT, optionName) == 0)
        {
            /*this is getting the x509 certificate. In this case, value is a pointer to a const char* that contains the certificate as a null terminated string*/
            if (mallocAndStrcpy_s((char**)savedValue, value) != 0)
            {
                LogError("unable to clone the x509 certificate content");
                result = HTTPAPI_ERROR;
            }
            else
            {
                /*return OK when the certificate has been cloned successfully*/
                result = HTTPAPI_OK;
            }
        }
#ifdef USE_OPENSSL
        else if (strcmp(OPTION_OPENSSL_PRIVATE_KEY_TYPE, optionName) == 0)
        {
            const OPTION_OPENSSL_KEY_TYPE type = *(const OPTION_OPENSSL_KEY_TYPE*)value;
            if (type == KEY_TYPE_DEFAULT || type == KEY_TYPE_ENGINE)
            {
                OPTION_OPENSSL_KEY_TYPE* temp = malloc(sizeof(OPTION_OPENSSL_KEY_TYPE));
                if (temp == NULL)
                {
                    LogError("unable to clone x509PrivatekeyType");
                    result = HTTPAPI_ERROR;
                }
                else
                {
                    *temp = type;
                    *savedValue = temp;
                    result = HTTPAPI_OK;
                }
            }
            else
            {
                LogError("Unknown x509PrivatekeyType: %i", type);
                result = HTTPAPI_ERROR;
            }
        }
        else if (strcmp(OPTION_OPENSSL_ENGINE, optionName) == 0)
        {
            /*this is getting the engine. In this case, value is a pointer to a const char* that contains the engine as a null terminated string*/
            if (mallocAndStrcpy_s((char**)savedValue, value) != 0)
            {
                LogError("unable to clone %s", optionName);
                result = HTTPAPI_ERROR;
            }
            else
            {
                /*return OK when the engine has been cloned successfully*/
                result = HTTPAPI_OK;
            }
        }
#endif
        else if (strcmp(SU_OPTION_X509_PRIVATE_KEY, optionName) == 0 || strcmp(OPTION_X509_ECC_KEY, optionName) == 0)
        {
            /*this is getting the x509 private key. In this case, value is a pointer to a const char* that contains the private key as a null terminated string*/
            if (mallocAndStrcpy_s((char**)savedValue, value) != 0)
            {
                LogError("unable to clone the x509 private key content");
                result = HTTPAPI_ERROR;
            }
            else
            {
                /*return OK when the private key has been cloned successfully*/
                result = HTTPAPI_OK;
            }
        }
        else if (strcmp("TrustedCerts", optionName) == 0)
        {
            if (mallocAndStrcpy_s((char**)savedValue, value) != 0)
            {
                LogError("unable to clone TrustedCerts");
                result = HTTPAPI_ERROR;
            }
            else
            {
                /*return OK when the certificates have been cloned successfully*/
                result = HTTPAPI_OK;
            }
        }
        else if (strcmp(OPTION_HTTP_PROXY, optionName) == 0)
        {
            HTTP_PROXY_OPTIONS* proxy_data = (HTTP_PROXY_OPTIONS*)value;

            HTTP_PROXY_OPTIONS* new_proxy_info = malloc(sizeof(HTTP_PROXY_OPTIONS));
            if (new_proxy_info == NULL)
            {
                LogError("unable to allocate proxy option information");
                result = HTTPAPI_ERROR;
            }
            else
            {
                new_proxy_info->host_address = proxy_data->host_address;
                new_proxy_info->port = proxy_data->port;
                new_proxy_info->password = proxy_data->password;
                new_proxy_info->username = proxy_data->username;
                *savedValue = new_proxy_info;
                result = HTTPAPI_OK;
            }
        }
        /*all "long" options are cloned in the same way*/
        else if (
            (strcmp(OPTION_CURL_LOW_SPEED_LIMIT, optionName) == 0) ||
            (strcmp(OPTION_CURL_LOW_SPEED_TIME, optionName) == 0) ||
            (strcmp(OPTION_CURL_FRESH_CONNECT, optionName) == 0) ||
            (strcmp(OPTION_CURL_FORBID_REUSE, optionName) == 0) ||
            (strcmp(OPTION_CURL_VERBOSE, optionName) == 0)
            )
        {
            /*by convention value is pointing to an long */
            long* temp = malloc(sizeof(long)); /*shall be freed by HTTPAPIEX*/
            if (temp == NULL)
            {
                result = HTTPAPI_ERROR;
                LogError("malloc failed (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else
            {
                *temp = *(const long*)value;
                *savedValue = temp;
                result = HTTPAPI_OK;
            }
        }
        else if (strcmp(OPTION_CURL_INTERFACE, optionName) == 0)
        {
            if (mallocAndStrcpy_s((char**)savedValue, value) != 0)
            {
                LogError("unable to clone the interface name");
                result = HTTPAPI_ERROR;
            }
            else
            {
                /*return OK when the interface name has been cloned successfully*/
                result = HTTPAPI_OK;
            }
        }
        else
        {
            result = HTTPAPI_INVALID_ARG;
            LogError("unknown option %s", optionName);
        }
    }
    return result;
}